

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurfmt.cpp
# Opt level: O0

void __thiscall icu_63::PluralFormat::PluralFormat(PluralFormat *this,PluralFormat *other)

{
  PluralFormat *other_local;
  PluralFormat *this_local;
  
  Format::Format(&this->super_Format,&other->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__PluralFormat_004a0990;
  Locale::Locale(&this->locale,&other->locale);
  MessagePattern::MessagePattern(&this->msgPattern,&other->msgPattern);
  this->numberFormat = (NumberFormat *)0x0;
  this->offset = other->offset;
  PluralSelectorAdapter::PluralSelectorAdapter(&this->pluralRulesWrapper);
  copyObjects(this,other);
  return;
}

Assistant:

PluralFormat::PluralFormat(const PluralFormat& other)
        : Format(other),
          locale(other.locale),
          msgPattern(other.msgPattern),
          numberFormat(NULL),
          offset(other.offset) {
    copyObjects(other);
}